

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void map_remove_(map_base_t *m,char *key)

{
  map_node_t *mem;
  map_node_t **ppmVar1;
  
  ppmVar1 = map_getref(m,key);
  if (ppmVar1 != (map_node_t **)0x0) {
    mem = *ppmVar1;
    *ppmVar1 = mem->next;
    golf_free_tracked(mem);
    m->nnodes = m->nnodes - 1;
  }
  return;
}

Assistant:

void map_remove_(map_base_t *m, const char *key) {
  map_node_t *node;
  map_node_t **next = map_getref(m, key);
  if (next) {
    node = *next;
    *next = (*next)->next;
    golf_free(node);
    m->nnodes--;
  }
}